

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_IDAT(ucvector *out,uchar *data,size_t datasize,LodePNGCompressSettings *zlibsettings)

{
  uint uVar1;
  uchar *zlib;
  size_t zlibsize;
  uchar *local_20;
  size_t local_18;
  
  local_20 = (uchar *)0x0;
  local_18 = 0;
  uVar1 = zlib_compress(&local_20,&local_18,data,datasize,zlibsettings);
  if (uVar1 == 0) {
    uVar1 = lodepng_chunk_createv(out,local_18,"IDAT",local_20);
  }
  free(local_20);
  return uVar1;
}

Assistant:

static unsigned addChunk_IDAT(ucvector* out, const unsigned char* data, size_t datasize,
                              LodePNGCompressSettings* zlibsettings) {
  unsigned error = 0;
  unsigned char* zlib = 0;
  size_t zlibsize = 0;

  error = zlib_compress(&zlib, &zlibsize, data, datasize, zlibsettings);
  if(!error) {
    error = lodepng_chunk_createv(out, zlibsize, "IDAT", zlib);
  }
  lodepng_free(zlib);
  return error;
}